

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Q3BSPFileImporter.cpp
# Opt level: O2

void __thiscall
Assimp::Q3BSPFileImporter::createTriangleTopology
          (Q3BSPFileImporter *this,Q3BSPModel *pModel,sQ3BSPFace *pQ3BSPFace,aiMesh *pMesh,
          uint *faceIdx,uint *vertIdx)

{
  aiVector3D *paVar1;
  float fVar2;
  uint uVar3;
  aiFace *paVar4;
  pointer ppsVar5;
  sQ3BSPVertex *psVar6;
  aiVector3D *paVar7;
  float fVar8;
  uint *puVar9;
  ulong uVar10;
  aiFace *paVar11;
  ulong uVar12;
  size_t i;
  ulong uVar13;
  
  uVar3 = *faceIdx;
  if (uVar3 < pMesh->mNumFaces) {
    paVar4 = pMesh->mFaces;
    paVar11 = paVar4 + uVar3;
    *faceIdx = uVar3 + 1;
    this->m_pCurrentFace = paVar11;
    if (paVar4 != (aiFace *)0x0) {
      paVar11->mNumIndices = 3;
      paVar4 = this->m_pCurrentFace;
      puVar9 = (uint *)operator_new__((ulong)paVar4->mNumIndices << 2);
      paVar4->mIndices = puVar9;
      uVar10 = 0;
      for (uVar13 = 0; uVar13 < (ulong)(long)pQ3BSPFace->iNumOfFaceVerts; uVar13 = uVar13 + 1) {
        uVar12 = (long)(pModel->m_Indices).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start[(long)pQ3BSPFace->iFaceVertexIndex + uVar13]
                 + (long)pQ3BSPFace->iVertexIndex;
        ppsVar5 = (pModel->m_Vertices).
                  super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if ((uVar12 < (ulong)((long)(pModel->m_Vertices).
                                    super__Vector_base<Assimp::Q3BSP::sQ3BSPVertex_*,_std::allocator<Assimp::Q3BSP::sQ3BSPVertex_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)ppsVar5 >> 3)
            ) && (psVar6 = ppsVar5[uVar12], psVar6 != (sQ3BSPVertex *)0x0)) {
          if (2 < uVar10) {
            uVar3 = *faceIdx;
            if (uVar3 < pMesh->mNumFaces) {
              paVar4 = pMesh->mFaces;
              paVar11 = paVar4 + uVar3;
              *faceIdx = uVar3 + 1;
              this->m_pCurrentFace = paVar11;
              if (paVar4 != (aiFace *)0x0) {
                paVar11->mNumIndices = 3;
                puVar9 = (uint *)operator_new__(0xc);
                this->m_pCurrentFace->mIndices = puVar9;
                *this->m_pCurrentFace->mIndices = *vertIdx;
              }
            }
            else {
              this->m_pCurrentFace = (aiFace *)0x0;
            }
            uVar10 = 0;
          }
          paVar7 = pMesh->mVertices;
          uVar3 = *vertIdx;
          fVar2 = (psVar6->vPosition).z;
          fVar8 = (psVar6->vPosition).y;
          paVar1 = paVar7 + uVar3;
          paVar1->x = (psVar6->vPosition).x;
          paVar1->y = fVar8;
          paVar7[uVar3].z = fVar2;
          paVar7 = pMesh->mNormals;
          uVar3 = *vertIdx;
          fVar2 = (psVar6->vNormal).z;
          fVar8 = (psVar6->vNormal).y;
          paVar1 = paVar7 + uVar3;
          paVar1->x = (psVar6->vNormal).x;
          paVar1->y = fVar8;
          paVar7[uVar3].z = fVar2;
          paVar7 = pMesh->mTextureCoords[0];
          uVar3 = *vertIdx;
          fVar2 = (psVar6->vTexCoord).y;
          paVar1 = paVar7 + uVar3;
          paVar1->x = (psVar6->vTexCoord).x;
          paVar1->y = fVar2;
          paVar7[uVar3].z = 0.0;
          paVar7 = pMesh->mTextureCoords[1];
          uVar3 = *vertIdx;
          fVar2 = (psVar6->vLightmap).y;
          paVar1 = paVar7 + uVar3;
          paVar1->x = (psVar6->vLightmap).x;
          paVar1->y = fVar2;
          paVar7[uVar3].z = 0.0;
          *vertIdx = *vertIdx + 1;
          uVar10 = uVar10 + 1;
        }
      }
    }
    return;
  }
  __assert_fail("faceIdx < pMesh->mNumFaces",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Q3BSP/Q3BSPFileImporter.cpp"
                ,0x178,
                "void Assimp::Q3BSPFileImporter::createTriangleTopology(const Q3BSP::Q3BSPModel *, sQ3BSPFace *, aiMesh *, unsigned int &, unsigned int &)"
               );
}

Assistant:

void Q3BSPFileImporter::createTriangleTopology( const Q3BSP::Q3BSPModel *pModel, sQ3BSPFace *pQ3BSPFace,
        aiMesh* pMesh, unsigned int &faceIdx, unsigned int &vertIdx ) {
    ai_assert( faceIdx < pMesh->mNumFaces );

    m_pCurrentFace = getNextFace( pMesh, faceIdx );
    if ( nullptr == m_pCurrentFace ) {
        return;
    }

    m_pCurrentFace->mNumIndices = 3;
    m_pCurrentFace->mIndices = new unsigned int[ m_pCurrentFace->mNumIndices ];

    size_t idx( 0 );
    for ( size_t i = 0; i < (size_t) pQ3BSPFace->iNumOfFaceVerts; ++i ) {
        const size_t index = pQ3BSPFace->iVertexIndex + pModel->m_Indices[ pQ3BSPFace->iFaceVertexIndex + i ];
        if ( index >= pModel->m_Vertices.size() ) {
            continue;
        }

        sQ3BSPVertex *pVertex = pModel->m_Vertices[ index ];
        if ( nullptr == pVertex ) {
            continue;
        }
        if (idx > 2) {
            idx = 0;
            m_pCurrentFace = getNextFace(pMesh, faceIdx);
            if (nullptr != m_pCurrentFace) {
                m_pCurrentFace->mNumIndices = 3;
                m_pCurrentFace->mIndices = new unsigned int[3];
                m_pCurrentFace->mIndices[ idx ] = vertIdx;
            }
        }

        pMesh->mVertices[ vertIdx ].Set( pVertex->vPosition.x, pVertex->vPosition.y, pVertex->vPosition.z );
        pMesh->mNormals[ vertIdx ].Set( pVertex->vNormal.x, pVertex->vNormal.y, pVertex->vNormal.z );

        pMesh->mTextureCoords[ 0 ][ vertIdx ].Set( pVertex->vTexCoord.x, pVertex->vTexCoord.y, 0.0f );
        pMesh->mTextureCoords[ 1 ][ vertIdx ].Set( pVertex->vLightmap.x, pVertex->vLightmap.y, 0.0f );

        vertIdx++;
        idx++;
    }
}